

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O1

void __thiscall
FIX::ThreadedSocketInitiator::doConnect(ThreadedSocketInitiator *this,SessionID *s,Dictionary *d)

{
  size_type *psVar1;
  NullLog *pNVar2;
  bool bVar3;
  int iVar4;
  socket_handle sVar5;
  Session *pSVar6;
  long *plVar7;
  undefined8 *puVar8;
  ThreadedSocketConnection *this_00;
  ulong *puVar9;
  long *plVar10;
  ulong uVar11;
  undefined8 uVar12;
  NullLog *pLog;
  Log *pLVar13;
  thread_id thread;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1f8;
  socket_handle local_1e4;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long lStack_1c8;
  long *local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  undefined8 uStack_1a8;
  long *local_1a0;
  undefined8 local_198;
  long local_190;
  undefined8 uStack_188;
  ulong *local_180;
  long local_178;
  ulong local_170;
  long lStack_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  string local_140;
  string local_120;
  string local_100;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  HostDetails host;
  
  pSVar6 = Session::lookupSession(s);
  DateTime::nowUtc();
  local_200 = host.address._M_string_length;
  aStack_1f8._M_allocated_capacity = host.address.field_2._M_allocated_capacity;
  thread = (thread_id)&PTR__DateTime_001f8898;
  bVar3 = TimeRange::isInRange(&pSVar6->m_sessionTime,(UtcTimeStamp *)&thread);
  if (!bVar3) {
    return;
  }
  HostDetailsProvider::getHost(&host,&this->m_hostDetailsProvider,s,d);
  thread = (thread_id)&aStack_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&thread,"ReconnectInterval","");
  bVar3 = Dictionary::has(d,(string *)&thread);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thread != &aStack_1f8) {
    operator_delete((void *)thread,aStack_1f8._M_allocated_capacity + 1);
  }
  if (bVar3) {
    thread = (thread_id)&aStack_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&thread,"ReconnectInterval","");
    iVar4 = Dictionary::getInt(d,(string *)&thread);
    this->m_reconnectInterval = iVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)thread != &aStack_1f8) {
      operator_delete((void *)thread,aStack_1f8._M_allocated_capacity + 1);
    }
  }
  sVar5 = socket_createConnector();
  if (this->m_noDelay == true) {
    socket_setsockopt(sVar5,1);
  }
  if (this->m_sendBufSize != 0) {
    socket_setsockopt(sVar5,7,this->m_sendBufSize);
  }
  if (this->m_rcvBufSize != 0) {
    socket_setsockopt(sVar5,8,this->m_rcvBufSize);
  }
  Initiator::setPending(&this->super_Initiator,s);
  std::operator+(&local_a0,"Connecting to ",&host.address);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_1d0 = *puVar9;
    lStack_1c8 = plVar7[3];
    local_1e0 = &local_1d0;
  }
  else {
    local_1d0 = *puVar9;
    local_1e0 = (ulong *)*plVar7;
  }
  local_1d8 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  IntTConvertor<int>::convert_abi_cxx11_
            (&local_100,(IntTConvertor<int> *)(ulong)(ushort)host.port,(int)local_1d8);
  uVar11 = 0xf;
  if (local_1e0 != &local_1d0) {
    uVar11 = local_1d0;
  }
  if (uVar11 < local_100._M_string_length + local_1d8) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      uVar12 = local_100.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_100._M_string_length + local_1d8) goto LAB_001c2714;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_1e0);
  }
  else {
LAB_001c2714:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_100._M_dataplus._M_p);
  }
  local_1c0 = &local_1b0;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_1b0 = *plVar7;
    uStack_1a8 = puVar8[3];
  }
  else {
    local_1b0 = *plVar7;
    local_1c0 = (long *)*puVar8;
  }
  local_1b8 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_b0 = *plVar10;
    lStack_a8 = plVar7[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar10;
    local_c0 = (long *)*plVar7;
  }
  local_b8 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c0,(ulong)host.sourceAddress._M_dataplus._M_p);
  local_e0 = &local_d0;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_d0 = *plVar10;
    lStack_c8 = plVar7[3];
  }
  else {
    local_d0 = *plVar10;
    local_e0 = (long *)*plVar7;
  }
  local_d8 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_1e4 = sVar5;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_170 = *puVar9;
    lStack_168 = plVar7[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *puVar9;
    local_180 = (ulong *)*plVar7;
  }
  local_178 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  IntTConvertor<int>::convert_abi_cxx11_
            (&local_120,(IntTConvertor<int> *)(ulong)(ushort)host.sourcePort,(int)local_178);
  uVar11 = 0xf;
  if (local_180 != &local_170) {
    uVar11 = local_170;
  }
  if (uVar11 < local_120._M_string_length + local_178) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      uVar12 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_120._M_string_length + local_178) goto LAB_001c291c;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_180);
  }
  else {
LAB_001c291c:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_120._M_dataplus._M_p);
  }
  local_1a0 = &local_190;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_190 = *plVar7;
    uStack_188 = puVar8[3];
  }
  else {
    local_190 = *plVar7;
    local_1a0 = (long *)*puVar8;
  }
  local_198 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_150 = *puVar9;
    lStack_148 = plVar7[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar9;
    local_160 = (ulong *)*plVar7;
  }
  local_158 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  IntTConvertor<int>::convert_abi_cxx11_
            (&local_140,(IntTConvertor<int> *)(ulong)(uint)this->m_reconnectInterval,(int)local_158)
  ;
  uVar11 = 0xf;
  if (local_160 != &local_150) {
    uVar11 = local_150;
  }
  if (uVar11 < local_140._M_string_length + local_158) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      uVar12 = local_140.field_2._M_allocated_capacity;
    }
    if (local_140._M_string_length + local_158 <= (ulong)uVar12) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,(ulong)local_160);
      goto LAB_001c2a7e;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_140._M_dataplus._M_p);
LAB_001c2a7e:
  thread = (thread_id)&aStack_1f8;
  psVar1 = puVar8 + 2;
  if ((size_type *)*puVar8 == psVar1) {
    aStack_1f8._M_allocated_capacity = *psVar1;
    aStack_1f8._8_4_ = *(undefined4 *)(puVar8 + 3);
    aStack_1f8._12_4_ = *(undefined4 *)((long)puVar8 + 0x1c);
  }
  else {
    aStack_1f8._M_allocated_capacity = *psVar1;
    thread = (thread_id)*puVar8;
  }
  local_200 = puVar8[1];
  *puVar8 = psVar1;
  pLVar13 = &(pSVar6->m_state).super_Log;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  (*pLVar13->_vptr_Log[6])(pLVar13,&thread);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thread != &aStack_1f8) {
    operator_delete((void *)thread,aStack_1f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  sVar5 = local_1e4;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  this_00 = (ThreadedSocketConnection *)operator_new(0x20c8);
  pNVar2 = (NullLog *)(this->super_Initiator).m_pLog;
  pLog = &(this->super_Initiator).m_nullLog;
  if (pNVar2 != (NullLog *)0x0) {
    pLog = pNVar2;
  }
  ThreadedSocketConnection::ThreadedSocketConnection
            (this_00,s,sVar5,&host.address,host.port,&pLog->super_Log,&host.sourceAddress,
             host.sourcePort);
  puVar8 = (undefined8 *)operator_new(0x10);
  *puVar8 = this;
  puVar8[1] = this_00;
  Mutex::lock(&this->m_mutex);
  bVar3 = thread_spawn(socketThread,puVar8,&thread);
  if (bVar3) {
    addThread(this,sVar5,thread);
  }
  else {
    operator_delete(puVar8,0x10);
    (*(this_00->super_Responder)._vptr_Responder[3])(this_00);
    (*(this_00->super_Responder)._vptr_Responder[1])(this_00);
    Initiator::setDisconnected(&this->super_Initiator,s);
  }
  iVar4 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar4 + -1;
  if (iVar4 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)host.sourceAddress._M_dataplus._M_p != &host.sourceAddress.field_2) {
    operator_delete(host.sourceAddress._M_dataplus._M_p,
                    host.sourceAddress.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)host.address._M_dataplus._M_p != &host.address.field_2) {
    operator_delete(host.address._M_dataplus._M_p,host.address.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ThreadedSocketInitiator::doConnect(const SessionID &s, const Dictionary &d) {
  try {
    Session *session = Session::lookupSession(s);
    if (!session->isSessionTime(UtcTimeStamp::now())) {
      return;
    }

    Log *log = session->getLog();

    HostDetails host = m_hostDetailsProvider.getHost(s, d);
    if (d.has(RECONNECT_INTERVAL)) // ReconnectInterval in [SESSION]
    {
      m_reconnectInterval = d.getInt(RECONNECT_INTERVAL);
    }

    socket_handle socket = socket_createConnector();
    if (m_noDelay) {
      socket_setsockopt(socket, TCP_NODELAY);
    }
    if (m_sendBufSize) {
      socket_setsockopt(socket, SO_SNDBUF, m_sendBufSize);
    }
    if (m_rcvBufSize) {
      socket_setsockopt(socket, SO_RCVBUF, m_rcvBufSize);
    }

    setPending(s);
    log->onEvent(
        "Connecting to " + host.address + " on port " + IntConvertor::convert((unsigned short)host.port) + " (Source "
        + host.sourceAddress + ":" + IntConvertor::convert((unsigned short)host.sourcePort)
        + ") ReconnectInterval=" + IntConvertor::convert((int)m_reconnectInterval));

    ThreadedSocketConnection *pConnection = new ThreadedSocketConnection(
        s,
        socket,
        host.address,
        host.port,
        getLog(),
        host.sourceAddress,
        host.sourcePort);

    ThreadPair *pair = new ThreadPair(this, pConnection);

    {
      Locker l(m_mutex);
      thread_id thread;
      if (thread_spawn(&socketThread, pair, thread)) {
        addThread(socket, thread);
      } else {
        delete pair;
        pConnection->disconnect();
        delete pConnection;
        setDisconnected(s);
      }
    }
  } catch (std::exception &) {}
}